

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpargrid.cpp
# Opt level: O3

short __thiscall TPZGenPartialGrid::Read(TPZGenPartialGrid *this,TPZGeoMesh *grid)

{
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  TPZGeoNode *this_00;
  int *piVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  TPZVec<long> nos;
  TPZVec<double> coor;
  int64_t index;
  TPZVec<long> local_78;
  TPZVec<double> local_58;
  undefined1 local_38 [8];
  
  local_78._vptr_TPZVec = (_func_int **)0x0;
  TPZVec<double>::TPZVec(&local_58,2,(double *)&local_78);
  if ((grid->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements < this->fNumNodes) {
    TPZAdmChunkVector<TPZGeoNode,_10>::Resize(&grid->fNodeVec,(int)this->fNumNodes);
  }
  piVar6 = (this->fRangex).fStore;
  if (*piVar6 <= piVar6[1]) {
    piVar7 = (this->fRangey).fStore;
    iVar8 = *piVar6;
    do {
      iVar11 = *piVar7;
      if (*piVar7 <= piVar7[1]) {
        do {
          pdVar1 = (this->fX0).fStore;
          iVar10 = *(this->fNx).fStore + 1;
          iVar4 = iVar10 * iVar11 + iVar8;
          pdVar2 = (this->fDelx).fStore;
          *local_58.fStore = (double)(iVar4 % iVar10) * *pdVar2 + *pdVar1;
          local_58.fStore[1] = (double)(iVar4 / iVar10) * pdVar2[1] + pdVar1[1];
          this_00 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                              (&(grid->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar4);
          TPZGeoNode::Initialize(this_00,&local_58,grid);
          piVar7 = (this->fRangey).fStore;
          bVar3 = iVar11 < piVar7[1];
          iVar11 = iVar11 + 1;
        } while (bVar3);
        piVar6 = (this->fRangex).fStore;
      }
      bVar3 = iVar8 < piVar6[1];
      iVar8 = iVar8 + 1;
    } while (bVar3);
  }
  TPZVec<long>::TPZVec(&local_78,4);
  piVar6 = (this->fRangex).fStore;
  iVar8 = *piVar6;
  if (iVar8 < piVar6[1]) {
    piVar7 = (this->fRangey).fStore;
    do {
      iVar11 = *piVar7;
      if (iVar11 < piVar7[1]) {
        do {
          iVar4 = *(this->fNx).fStore;
          iVar10 = iVar4 * iVar11 + iVar8;
          iVar5 = iVar10 / iVar4;
          iVar10 = iVar10 % iVar4;
          iVar9 = (iVar4 + 1) * iVar5;
          *local_78.fStore = (long)(iVar9 + iVar10);
          local_78.fStore[1] = (long)(iVar9 + iVar10 + 1);
          iVar4 = (iVar5 + 1) * (iVar4 + 1);
          local_78.fStore[2] = (long)(iVar4 + iVar10 + 1);
          local_78.fStore[3] = (long)(iVar10 + iVar4);
          if (this->fElementType == 0) {
            (*(grid->super_TPZSavable)._vptr_TPZSavable[0xc])(grid,3,&local_78,1,local_38,1);
          }
          else {
            (*(grid->super_TPZSavable)._vptr_TPZSavable[0xc])(grid,2,&local_78,1,local_38,1);
            *(int *)(local_78.fStore + 1) = (int)local_78.fStore[2];
            *(undefined4 *)((long)local_78.fStore + 0xc) =
                 *(undefined4 *)((long)local_78.fStore + 0x14);
            *(int *)(local_78.fStore + 2) = (int)local_78.fStore[3];
            *(undefined4 *)((long)local_78.fStore + 0x14) =
                 *(undefined4 *)((long)local_78.fStore + 0x1c);
            (*(grid->super_TPZSavable)._vptr_TPZSavable[0xc])(grid,2,&local_78,1,local_38,1);
          }
          iVar11 = iVar11 + 1;
          piVar7 = (this->fRangey).fStore;
        } while (iVar11 < piVar7[1]);
        piVar6 = (this->fRangex).fStore;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < piVar6[1]);
  }
  TPZGeoMesh::BuildConnectivity(grid);
  local_78._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  if (local_78.fStore != (long *)0x0) {
    operator_delete__(local_78.fStore);
  }
  local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_58.fStore != (double *)0x0) {
    operator_delete__(local_58.fStore);
  }
  return 0;
}

Assistant:

short
TPZGenPartialGrid::Read (TPZGeoMesh &grid) {
	
	TPZVec<REAL> coor(2,0.);
	int i,j;
	int64_t index;
	
	if(grid.NodeVec().NElements() < fNumNodes) grid.NodeVec().Resize(fNumNodes);
	for(i=fRangex[0]; i<fRangex[1]+1; i++) {
		for(j = fRangey[0]; j<fRangey[1]+1; j++) {
			index = NodeIndex(i,j);
			Coord(index,coor);
			grid.NodeVec()[index].Initialize(coor,grid);
		}
	}
	//
	//numbering the nodes
	//
	// create the geometric elements (retangular)
	
	TPZVec<int64_t> nos(4);
	for(i=fRangex[0]; i<fRangex[1]; i++) {
		for(j=fRangey[0]; j<fRangey[1]; j++) {
			index = ElementIndex(i,j);
			ElementConnectivity(index,nos);
			if(fElementType == 0) {
				int64_t index;   
				grid.CreateGeoElement(EQuadrilateral,nos,1,index);
			} else {
				int64_t index;   
				grid.CreateGeoElement(ETriangle,nos,1,index);
				nos[1] = nos[2];
				nos[2] = nos[3];
				grid.CreateGeoElement(ETriangle,nos,1,index);
			}
		}
	}
	grid.BuildConnectivity();
	return 0;
	
}